

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::initFromPPCDoubleDoubleAPInt(IEEEFloat *this,APInt *api)

{
  bool bVar1;
  uint uVar2;
  uint64_t *puVar3;
  byte local_72;
  byte local_71;
  APInt local_68;
  undefined1 local_58 [8];
  IEEEFloat v;
  bool local_2d;
  opStatus local_2c;
  bool losesInfo;
  uint64_t uStack_28;
  opStatus fs;
  uint64_t i2;
  uint64_t i1;
  APInt *api_local;
  IEEEFloat *this_local;
  
  i1 = (uint64_t)api;
  api_local = (APInt *)this;
  uVar2 = APInt::getBitWidth(api);
  if (uVar2 != 0x80) {
    __assert_fail("api.getBitWidth()==128",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc03,"void llvm::detail::IEEEFloat::initFromPPCDoubleDoubleAPInt(const APInt &)"
                 );
  }
  puVar3 = APInt::getRawData((APInt *)i1);
  i2 = *puVar3;
  puVar3 = APInt::getRawData((APInt *)i1);
  uStack_28 = puVar3[1];
  APInt::APInt((APInt *)&v.exponent,0x40,i2,false);
  initFromDoubleAPInt(this,(APInt *)&v.exponent);
  APInt::~APInt((APInt *)&v.exponent);
  local_2c = convert(this,(fltSemantics *)semPPCDoubleDoubleLegacy,rmNearestTiesToEven,&local_2d);
  local_71 = 0;
  if (local_2c == opOK) {
    local_71 = local_2d ^ 0xff;
  }
  if ((local_71 & 1) != 0) {
    bVar1 = isFiniteNonZero(this);
    if (bVar1) {
      APInt::APInt(&local_68,0x40,uStack_28,false);
      IEEEFloat((IEEEFloat *)local_58,(fltSemantics *)semIEEEdouble,&local_68);
      APInt::~APInt(&local_68);
      local_2c = convert((IEEEFloat *)local_58,(fltSemantics *)semPPCDoubleDoubleLegacy,
                         rmNearestTiesToEven,&local_2d);
      local_72 = 0;
      if (local_2c == opOK) {
        local_72 = local_2d ^ 0xff;
      }
      if ((local_72 & 1) == 0) {
        __assert_fail("fs == opOK && !losesInfo",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xc13,
                      "void llvm::detail::IEEEFloat::initFromPPCDoubleDoubleAPInt(const APInt &)");
      }
      add(this,(IEEEFloat *)local_58,rmNearestTiesToEven);
      ~IEEEFloat((IEEEFloat *)local_58);
    }
    return;
  }
  __assert_fail("fs == opOK && !losesInfo",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xc0c,"void llvm::detail::IEEEFloat::initFromPPCDoubleDoubleAPInt(const APInt &)");
}

Assistant:

void IEEEFloat::initFromPPCDoubleDoubleAPInt(const APInt &api) {
  assert(api.getBitWidth()==128);
  uint64_t i1 = api.getRawData()[0];
  uint64_t i2 = api.getRawData()[1];
  opStatus fs;
  bool losesInfo;

  // Get the first double and convert to our format.
  initFromDoubleAPInt(APInt(64, i1));
  fs = convert(semPPCDoubleDoubleLegacy, rmNearestTiesToEven, &losesInfo);
  assert(fs == opOK && !losesInfo);
  (void)fs;

  // Unless we have a special case, add in second double.
  if (isFiniteNonZero()) {
    IEEEFloat v(semIEEEdouble, APInt(64, i2));
    fs = v.convert(semPPCDoubleDoubleLegacy, rmNearestTiesToEven, &losesInfo);
    assert(fs == opOK && !losesInfo);
    (void)fs;

    add(v, rmNearestTiesToEven);
  }
}